

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

size_t art_size_in_bytes_at(art_node_t *node)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  art_indexed_child_t aVar4;
  
  if (((ulong)node & 1) == 0) {
    if ((ulong)(byte)*node < 4) {
      sVar3 = *(size_t *)(&DAT_00128450 + (ulong)(byte)*node * 8);
    }
    else {
      sVar3 = 0;
    }
    uVar2 = 0xffffffffffffffff;
    while( true ) {
      aVar4 = art_node_next_child(node,(int)uVar2);
      if (aVar4.child == (art_node_t *)0x0) break;
      sVar1 = art_size_in_bytes_at(aVar4.child);
      sVar3 = sVar3 + sVar1;
      uVar2 = aVar4._8_8_ & 0xff;
    }
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

size_t art_size_in_bytes_at(const art_node_t *node) {
    if (art_is_leaf(node)) {
        return 0;
    }
    size_t size = 0;
    switch (art_get_type((art_inner_node_t *)node)) {
        case ART_NODE4_TYPE: {
            size += sizeof(art_node4_t);
        } break;
        case ART_NODE16_TYPE: {
            size += sizeof(art_node16_t);
        } break;
        case ART_NODE48_TYPE: {
            size += sizeof(art_node48_t);
        } break;
        case ART_NODE256_TYPE: {
            size += sizeof(art_node256_t);
        } break;
        default:
            assert(false);
            break;
    }
    art_indexed_child_t indexed_child = art_node_next_child(node, -1);
    while (indexed_child.child != NULL) {
        size += art_size_in_bytes_at(indexed_child.child);
        indexed_child = art_node_next_child(node, indexed_child.index);
    }
    return size;
}